

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

int count_frames(FrameWindowBuffer *buffer,int64_t duration)

{
  long local_50;
  int64_t ts_start;
  FrameRecord *record;
  int i;
  int index;
  int num_frames;
  int64_t time_limit;
  int64_t current_time;
  int current_idx;
  int64_t duration_local;
  FrameWindowBuffer *buffer_local;
  
  index = (buffer->start + buffer->num + -1) % 0x100;
  local_50 = buffer->buf[index].ts_end;
  if (local_50 - duration < 1) {
    local_50 = 0;
  }
  else {
    local_50 = local_50 - duration;
  }
  num_frames = 1;
  i = buffer->num + -2;
  while( true ) {
    index = index + -1;
    if (i < 0) {
      return num_frames;
    }
    if (index < 0) {
      index = 0xff;
    }
    if ((buffer->buf[index].show_frame != 0) && (buffer->buf[index].ts_start < local_50)) break;
    i = i + -1;
    num_frames = num_frames + 1;
  }
  return num_frames;
}

Assistant:

static int count_frames(const FrameWindowBuffer *const buffer,
                        int64_t duration) {
  const int current_idx = (buffer->start + buffer->num - 1) % FRAME_WINDOW_SIZE;
  // Assume current frame is shown frame.
  assert(buffer->buf[current_idx].show_frame);

  const int64_t current_time = buffer->buf[current_idx].ts_end;
  const int64_t time_limit = AOMMAX(current_time - duration, 0);
  int num_frames = 1;
  int index = current_idx - 1;
  for (int i = buffer->num - 2; i >= 0; --i, --index, ++num_frames) {
    if (index < 0) index = FRAME_WINDOW_SIZE - 1;
    const FrameRecord *const record = &buffer->buf[index];
    if (!record->show_frame) continue;
    const int64_t ts_start = record->ts_start;
    if (ts_start < time_limit) break;
  }

  return num_frames;
}